

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setDelayedValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int index,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  bool bVar1;
  iterator __rhs;
  pointer ppVar2;
  iterator iVar3;
  iterator fnd;
  lock_guard<std::mutex> lock;
  map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00
  ;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_40;
  key_type *in_stack_ffffffffffffffc8;
  map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  __rhs = std::
          map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(in_stack_ffffffffffffff88,(key_type *)0x580a19);
  iVar3 = __rhs;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd8,&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x580a5d);
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_value(in_stack_ffffffffffffffe0,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3._M_node);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x580a7a);
    this_00 = &ppVar2->second;
    iVar3._M_node =
         (_Base_ptr)
         std::
         map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(in_stack_ffffffffffffffb0,
              (promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__rhs._M_node);
    std::
    map<int,std::promise<std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)this_00,iVar3);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x580afd);
  return;
}

Assistant:

void setDelayedValue(int index, X&& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = promiseByInteger.find(index);
        if (fnd != promiseByInteger.end()) {
            fnd->second.set_value(std::move(val));
            usedPromiseByInteger[index] = std::move(fnd->second);
            promiseByInteger.erase(fnd);
        }
    }